

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

void __thiscall tinyxml2::XMLPrinter::XMLPrinter(XMLPrinter *this,FILE *file,bool compact,int depth)

{
  long lVar1;
  
  (this->super_XMLVisitor)._vptr_XMLVisitor = (_func_int **)&PTR__XMLPrinter_001147a0;
  this->_elementJustOpened = false;
  (this->_stack)._mem = (this->_stack)._pool;
  (this->_stack)._allocated = 10;
  (this->_stack)._size = 0;
  this->_firstElement = true;
  this->_fp = file;
  this->_depth = depth;
  this->_textDepth = -1;
  this->_processEntities = true;
  this->_compactMode = compact;
  (this->_buffer)._mem = (this->_buffer)._pool;
  (this->_buffer)._allocated = 0x14;
  (this->_buffer)._size = 0;
  for (lVar1 = -0x40; lVar1 != 0; lVar1 = lVar1 + 1) {
    this->_restrictedEntityFlag[lVar1] = false;
    (this->_buffer)._pool[lVar1 + -0xe] = '\0';
  }
  for (lVar1 = 0xc; lVar1 != 0x5c; lVar1 = lVar1 + 0x10) {
    this->_entityFlag[*(byte *)((long)&entities + lVar1)] = true;
  }
  this->_restrictedEntityFlag[0x26] = true;
  this->_restrictedEntityFlag[0x3c] = true;
  this->_restrictedEntityFlag[0x3e] = true;
  DynArray<char,_20>::Push(&this->_buffer,'\0');
  return;
}

Assistant:

XMLPrinter::XMLPrinter( FILE* file, bool compact, int depth ) :
    _elementJustOpened( false ),
    _firstElement( true ),
    _fp( file ),
    _depth( depth ),
    _textDepth( -1 ),
    _processEntities( true ),
    _compactMode( compact )
{
    for( int i=0; i<ENTITY_RANGE; ++i ) {
        _entityFlag[i] = false;
        _restrictedEntityFlag[i] = false;
    }
    for( int i=0; i<NUM_ENTITIES; ++i ) {
        const char entityValue = entities[i].value;
        TIXMLASSERT( ((unsigned char)entityValue) < ENTITY_RANGE );
        _entityFlag[ (unsigned char)entityValue ] = true;
    }
    _restrictedEntityFlag[(unsigned char)'&'] = true;
    _restrictedEntityFlag[(unsigned char)'<'] = true;
    _restrictedEntityFlag[(unsigned char)'>'] = true;	// not required, but consistency is nice
    _buffer.Push( 0 );
}